

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootchart.c
# Opt level: O1

void file_buff_write(FileBuff buff,void *src,int len)

{
  int iVar1;
  int iVar2;
  
  if (0 < len) {
    do {
      iVar1 = 0x10000 - buff->count;
      if (len <= iVar1) {
        iVar1 = len;
      }
      memcpy(buff->data + buff->count,src,(long)iVar1);
      iVar2 = buff->count + iVar1;
      buff->count = iVar2;
      if (iVar2 == 0x10000) {
        unix_write(buff->fd,buff->data,0x10000);
        buff->count = 0;
      }
      len = len - iVar1;
      src = (void *)((long)src + (long)iVar1);
    } while (0 < len);
  }
  return;
}

Assistant:

static void
file_buff_write( FileBuff  buff, const void*  src, int  len )
{
    while (len > 0) {
        int  avail = sizeof(buff->data) - buff->count;
        if (avail > len)
            avail = len;

        memcpy( buff->data + buff->count, src, avail );
        len -= avail;
        src  = (char*)src + avail;

        buff->count += avail;
        if (buff->count == FILE_BUFF_SIZE) {
            unix_write( buff->fd, buff->data, buff->count );
            buff->count = 0;
        }
    }
}